

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::PathTypeHandlerBase::ProcessFixedFieldChange
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex slotIndex,Var value,bool isNonFixed,PropertyRecord *propertyRecord)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  BOOL BVar6;
  DynamicTypeHandler *pDVar7;
  undefined4 *puVar8;
  PathTypeHandlerBase *this_00;
  TypePath *pTVar9;
  
  pDVar7 = DynamicObject::GetTypeHandler(instance);
  if ((pDVar7->flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xc52,"(!instance->GetTypeHandler()->GetIsShared())",
                                "!instance->GetTypeHandler()->GetIsShared()");
    if (!bVar3) goto LAB_00dbe1d3;
    *puVar8 = 0;
  }
  BVar6 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
  if (BVar6 != 0 && !isNonFixed) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xc55,"(!instance->IsExternal() || isNonFixed)",
                                "!instance->IsExternal() || isNonFixed");
    if (!bVar3) goto LAB_00dbe1d3;
    *puVar8 = 0;
  }
  if (DAT_015bf361 != '\x01') {
    return true;
  }
  this_00 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler(instance);
  uVar5 = (ushort)((((this_00->typePath).ptr)->data).ptr)->maxInitializedLength;
  if (slotIndex < uVar5) {
    InvalidateFixedFieldAt
              (this_00,propertyId,slotIndex,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
    pTVar9 = (this_00->typePath).ptr;
    if (((slotIndex + 1 == (uint)((pTVar9->data).ptr)->maxInitializedLength) &&
        (pRVar1 = (pTVar9->singletonInstance).ptr,
        pRVar1 != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) &&
       ((DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef != instance)) {
      bVar3 = DynamicTypeHandler::ShouldFixAnyProperties();
      pTVar9 = (this_00->typePath).ptr;
      if ((!bVar3) &&
         ((pTVar9->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc8e,"(newTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                    "newTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
        if (!bVar3) goto LAB_00dbe1d3;
        *puVar8 = 0;
        pTVar9 = (this_00->typePath).ptr;
      }
      (pTVar9->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  else {
    if (uVar5 != slotIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc65,
                                  "(slotIndex == newTypeHandler->GetTypePath()->GetMaxInitializedLength())"
                                  ,"Adding properties out of order?");
      if (!bVar3) goto LAB_00dbe1d3;
      *puVar8 = 0;
    }
    bVar3 = DynamicTypeHandler::ShouldFixAnyProperties();
    if ((bVar3) && (bVar3 = DynamicTypeHandler::CanBeSingletonInstance(instance), bVar3)) {
      if ((uint)propertyId < 0x10 || isNonFixed) {
LAB_00dbe008:
        bVar3 = false;
      }
      else {
        bVar3 = VarIs<Js::JavascriptFunction>(value);
        if (bVar3) {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
          bVar3 = true;
          if (bVar4) {
            bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixAccessorPropsPhase);
            bVar3 = !bVar3;
          }
        }
        else {
          bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
          if (bVar3) goto LAB_00dbe008;
          bVar3 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                            (instance,propertyRecord,propertyId,value);
        }
      }
      TypePath::AddSingletonInstanceFieldAt
                ((this_00->typePath).ptr,instance,slotIndex,bVar3,
                 (uint)((this_00->super_DynamicTypeHandler).unusedBytes >> 1));
    }
    else {
      TypePath::AddSingletonInstanceFieldAt
                ((this_00->typePath).ptr,slotIndex,
                 (uint)((this_00->super_DynamicTypeHandler).unusedBytes >> 1));
    }
  }
  pTVar9 = (this->typePath).ptr;
  pRVar1 = (pTVar9->singletonInstance).ptr;
  if (((pRVar1 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
      ((this_00->typePath).ptr != pTVar9)) &&
     ((DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef == instance)) {
    if ((this->super_DynamicTypeHandler).unusedBytes >> 1 <
        (ushort)((pTVar9->data).ptr)->maxInitializedLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc9a,
                                  "(GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength())"
                                  ,
                                  "GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength()"
                                 );
      if (!bVar3) goto LAB_00dbe1d3;
      *puVar8 = 0;
    }
    bVar3 = DynamicTypeHandler::ShouldFixAnyProperties();
    pTVar9 = (this->typePath).ptr;
    if ((!bVar3) &&
       ((pTVar9->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc9b,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar3) {
LAB_00dbe1d3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pTVar9 = (this->typePath).ptr;
    }
    (pTVar9->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  return slotIndex < uVar5;
}

Assistant:

bool PathTypeHandlerBase::ProcessFixedFieldChange(DynamicObject* instance, PropertyId propertyId, PropertyIndex slotIndex, Var value, bool isNonFixed,const PropertyRecord * propertyRecord)
    {
        Assert(!instance->GetTypeHandler()->GetIsShared());
        // We don't want fixed properties on external objects, either external properties or expando properties.
        // See DynamicObject::ResetObject for more information.
        Assert(!instance->IsExternal() || isNonFixed);

        if (!FixPropsOnPathTypes())
        {
            return true;
        }

        bool populateInlineCache = true;

        PathTypeHandlerBase* newTypeHandler = (PathTypeHandlerBase*)instance->GetTypeHandler();

        if (slotIndex >= newTypeHandler->GetTypePath()->GetMaxInitializedLength())
        {
            // We are adding a property where no instance property has been set before.  We rely on properties being
            // added in order of indexes to be sure that we don't leave any uninitialized properties interspersed with
            // initialized ones, which could lead to incorrect behavior.  See comment in TypePath::Branch.
            AssertMsg(slotIndex == newTypeHandler->GetTypePath()->GetMaxInitializedLength(), "Adding properties out of order?");

            // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to
            // undefined or even some other special illegal value (for let or const, currently == null)
            // Assert(instance->GetSlot(index) == nullptr);

            if (ShouldFixAnyProperties() && CanBeSingletonInstance(instance))
            {
                bool markAsFixed = !isNonFixed && !IsInternalPropertyId(propertyId) &&
                    (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() || ShouldFixAccessorProperties() :
                                    (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyRecord, propertyId, value)));

                // Mark the newly added field as fixed and prevent population of inline caches.

                newTypeHandler->GetTypePath()->AddSingletonInstanceFieldAt(instance, slotIndex, markAsFixed, newTypeHandler->GetPathLength());
            }
            else
            {
                newTypeHandler->GetTypePath()->AddSingletonInstanceFieldAt(slotIndex, newTypeHandler->GetPathLength());
            }

            populateInlineCache = false;
        }
        else
        {
            newTypeHandler->InvalidateFixedFieldAt(propertyId, slotIndex, instance->GetScriptContext());

            // We have now reached the most advanced instance along this path.  If this instance is not the singleton instance,
            // then the former singleton instance (if any) is no longer a singleton.  This instance could be the singleton
            // instance, if we just happen to set (overwrite) its last property.
            if (slotIndex + 1 == newTypeHandler->GetTypePath()->GetMaxInitializedLength())
            {
                // If we cleared the singleton instance while some fields remained fixed, the instance would
                // be collectible, and yet some code would expect to see values and call methods on it. We rely on the
                // fact that we always add properties to (pre-initialized) type handlers in the order they appear
                // on the type path.  By the time we reach the singleton instance, all fixed fields will have been invalidated.
                // Otherwise, some fields could remain fixed (or even uninitialized) and we would have to spin off a loop here
                // to invalidate any remaining fixed fields
                auto singletonWeakRef = newTypeHandler->GetTypePath()->GetSingletonInstance();
                if (singletonWeakRef != nullptr && instance != singletonWeakRef->Get())
                {
                    Assert(newTypeHandler->HasSingletonInstanceOnlyIfNeeded());
                    newTypeHandler->GetTypePath()->ClearSingletonInstance();
                }
            }
        }

        // If we branched and this is the singleton instance, we need to remove it from this type handler.  The only time
        // this can happen is when another not fully initialized instance is ahead of this one on the current path.
        auto singletonWeakRef = this->GetTypePath()->GetSingletonInstance();
        if (newTypeHandler->GetTypePath() != this->GetTypePath() && singletonWeakRef != nullptr && singletonWeakRef->Get() == instance)
        {
            // If this is the singleton instance, there shouldn't be any other initialized instance ahead of it on the old path.
            Assert(GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength());
            Assert(HasSingletonInstanceOnlyIfNeeded());
            this->GetTypePath()->ClearSingletonInstance();
        }

        return populateInlineCache;
    }